

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  int iVar1;
  undefined1 local_258 [8];
  secp256k1_fe bzinv3;
  secp256k1_fe bzinv2;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe az;
  secp256k1_fe *bzinv_local;
  secp256k1_ge *b_local;
  secp256k1_gej *a_local;
  secp256k1_gej *r_local;
  
  if (b->infinity == 0) {
    if (a->infinity == 0) {
      r->infinity = 0;
      secp256k1_fe_mul((secp256k1_fe *)(z12.n + 4),&a->z,bzinv);
      secp256k1_fe_sqr((secp256k1_fe *)(u1.n + 4),(secp256k1_fe *)(z12.n + 4));
      memcpy(u2.n + 4,a,0x28);
      secp256k1_fe_normalize_weak((secp256k1_fe *)(u2.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(s1.n + 4),&b->x,(secp256k1_fe *)(u1.n + 4));
      memcpy(s2.n + 4,&a->y,0x28);
      secp256k1_fe_normalize_weak((secp256k1_fe *)(s2.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(h.n + 4),&b->y,(secp256k1_fe *)(u1.n + 4));
      secp256k1_fe_mul((secp256k1_fe *)(h.n + 4),(secp256k1_fe *)(h.n + 4),
                       (secp256k1_fe *)(z12.n + 4));
      secp256k1_fe_negate((secp256k1_fe *)(i.n + 4),(secp256k1_fe *)(u2.n + 4),1);
      secp256k1_fe_add((secp256k1_fe *)(i.n + 4),(secp256k1_fe *)(s1.n + 4));
      secp256k1_fe_negate((secp256k1_fe *)(i2.n + 4),(secp256k1_fe *)(s2.n + 4),1);
      secp256k1_fe_add((secp256k1_fe *)(i2.n + 4),(secp256k1_fe *)(h.n + 4));
      iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)(i.n + 4));
      if (iVar1 == 0) {
        secp256k1_fe_sqr((secp256k1_fe *)(h2.n + 4),(secp256k1_fe *)(i2.n + 4));
        secp256k1_fe_sqr((secp256k1_fe *)(h3.n + 4),(secp256k1_fe *)(i.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(i.n + 4),
                         (secp256k1_fe *)(h3.n + 4));
        memcpy(&r->z,&a->z,0x28);
        secp256k1_fe_mul(&r->z,&r->z,(secp256k1_fe *)(i.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(bzinv2.n + 4),(secp256k1_fe *)(u2.n + 4),
                         (secp256k1_fe *)(h3.n + 4));
        memcpy(r,bzinv2.n + 4,0x28);
        secp256k1_fe_mul_int(&r->x,2);
        secp256k1_fe_add(&r->x,(secp256k1_fe *)(t.n + 4));
        secp256k1_fe_negate(&r->x,&r->x,3);
        secp256k1_fe_add(&r->x,(secp256k1_fe *)(h2.n + 4));
        secp256k1_fe_negate(&r->y,&r->x,5);
        secp256k1_fe_add(&r->y,(secp256k1_fe *)(bzinv2.n + 4));
        secp256k1_fe_mul(&r->y,&r->y,(secp256k1_fe *)(i2.n + 4));
        secp256k1_fe_mul((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(t.n + 4),
                         (secp256k1_fe *)(s2.n + 4));
        secp256k1_fe_negate((secp256k1_fe *)(t.n + 4),(secp256k1_fe *)(t.n + 4),1);
        secp256k1_fe_add(&r->y,(secp256k1_fe *)(t.n + 4));
      }
      else {
        iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)(i2.n + 4));
        if (iVar1 == 0) {
          secp256k1_gej_set_infinity(r);
        }
        else {
          secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
        }
      }
    }
    else {
      r->infinity = b->infinity;
      secp256k1_fe_sqr((secp256k1_fe *)(bzinv3.n + 4),bzinv);
      secp256k1_fe_mul((secp256k1_fe *)local_258,(secp256k1_fe *)(bzinv3.n + 4),bzinv);
      secp256k1_fe_mul(&r->x,&b->x,(secp256k1_fe *)(bzinv3.n + 4));
      secp256k1_fe_mul(&r->y,&b->y,(secp256k1_fe *)local_258);
      secp256k1_fe_set_int(&r->z,1);
    }
  }
  else {
    memcpy(r,a,0x80);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* 9 mul, 3 sqr, 4 normalize, 12 mul_int/add/negate */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (b->infinity) {
        *r = *a;
        return;
    }
    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        return;
    }
    r->infinity = 0;

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    r->z = a->z; secp256k1_fe_mul(&r->z, &r->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}